

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::changeRowsBounds(Highs *this,HighsInt *mask,double *lower,double *upper)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  HighsStatus HVar1;
  HighsIndexCollection index_collection;
  string local_f8;
  HighsLogOptions local_d8;
  HighsIndexCollection local_78;
  
  clearDerivedModelProperties(this);
  local_78.dimension_ = -1;
  local_78.is_interval_ = false;
  local_78.from_ = -1;
  local_78.to_ = -2;
  local_78.is_set_ = false;
  local_78.set_num_entries_ = -1;
  local_78.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_78.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_78.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_78._41_8_ = 0;
  create(&local_78,mask,(this->model_).lp_.num_row_);
  HVar1 = changeRowBoundsInterface(this,&local_78,lower,upper);
  local_d8.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_d8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_d8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_d8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_d8.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_d8.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  this_00 = &local_d8.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
  local_d8.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_d8.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"changeRowBounds","");
  HVar1 = interpretCallStatus(&local_d8,HVar1,kOk,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_d8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d8.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  if (HVar1 == kError) {
    HVar1 = kError;
  }
  else {
    HVar1 = returnFromHighs(this,HVar1);
  }
  if (local_78.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::changeRowsBounds(const HighsInt* mask, const double* lower,
                                    const double* upper) {
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, model_.lp_.num_row_);
  assert(!create_error);
  (void)create_error;
  HighsStatus call_status =
      changeRowBoundsInterface(index_collection, lower, upper);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeRowBounds");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}